

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.cpp
# Opt level: O0

bool __thiscall antlr::BaseAST::equalsTreePartial(BaseAST *this,RefAST *sub)

{
  byte bVar1;
  int iVar2;
  AST *pAVar3;
  AST *pAVar4;
  ASTRefCount *in_RSI;
  long *in_RDI;
  ASTRefCount<antlr::AST> *in_stack_ffffffffffffff68;
  ASTRefCount<antlr::AST> *this_00;
  ASTRefCount<antlr::AST> *in_stack_ffffffffffffff70;
  undefined1 local_48 [8];
  ASTRefCount<antlr::AST> local_40;
  ASTRefCount local_38 [24];
  undefined1 local_20 [31];
  bool local_1;
  
  pAVar3 = ASTRefCount::operator_cast_to_AST_(in_RSI);
  if (pAVar3 == (AST *)0x0) {
    local_1 = true;
  }
  else {
    ASTRefCount<antlr::AST>::ASTRefCount(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    bVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,local_20);
    ASTRefCount<antlr::AST>::~ASTRefCount(in_stack_ffffffffffffff70);
    if (((bVar1 ^ 0xff) & 1) == 0) {
      (**(code **)(*in_RDI + 0x68))();
      pAVar3 = ASTRefCount::operator_cast_to_AST_(local_38);
      ASTRefCount<antlr::AST>::~ASTRefCount(in_stack_ffffffffffffff70);
      if (pAVar3 != (AST *)0x0) {
        this_00 = &local_40;
        (**(code **)(*in_RDI + 0x68))();
        pAVar3 = ASTRefCount<antlr::AST>::operator->(this_00);
        pAVar4 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RSI);
        (*pAVar4->_vptr_AST[0xd])(local_48);
        iVar2 = (*pAVar3->_vptr_AST[6])(pAVar3,local_48);
        ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)pAVar3);
        ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)pAVar3);
        if ((((byte)iVar2 ^ 0xff) & 1) != 0) {
          return false;
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool BaseAST::equalsTreePartial(RefAST sub) const
{
	// the empty tree is always a subset of any tree.
	if (!sub)
		return true;

	// check roots first
	if (!equals(sub))
		return false;
	// if roots match, do full list partial match test on children.
	if (getFirstChild())
		if (!getFirstChild()->equalsListPartial(sub->getFirstChild()))
			return false;

	return true;
}